

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_simd.h
# Opt level: O3

void fromHalfZigZag_scalar(uint16_t *src,float *dst)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  int iVar4;
  uint uVar5;
  
  uVar2 = (uint)(short)*src;
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  *dst = fVar3;
  uVar2 = (uint)(short)src[1];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[1] = fVar3;
  uVar2 = (uint)(short)src[5];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[2] = fVar3;
  uVar2 = (uint)(short)src[6];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[3] = fVar3;
  uVar2 = (uint)(short)src[0xe];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[4] = fVar3;
  uVar2 = (uint)(short)src[0xf];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[5] = fVar3;
  uVar2 = (uint)(short)src[0x1b];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[6] = fVar3;
  uVar2 = (uint)(short)src[0x1c];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[7] = fVar3;
  uVar2 = (uint)(short)src[2];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[8] = fVar3;
  uVar2 = (uint)(short)src[4];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[9] = fVar3;
  uVar2 = (uint)(short)src[7];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[10] = fVar3;
  uVar2 = (uint)(short)src[0xd];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0xb] = fVar3;
  uVar2 = (uint)(short)src[0x10];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0xc] = fVar3;
  uVar2 = (uint)(short)src[0x1a];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0xd] = fVar3;
  uVar2 = (uint)(short)src[0x1d];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0xe] = fVar3;
  uVar2 = (uint)(short)src[0x2a];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0xf] = fVar3;
  uVar2 = (uint)(short)src[3];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x10] = fVar3;
  uVar2 = (uint)(short)src[8];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x11] = fVar3;
  uVar2 = (uint)(short)src[0xc];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x12] = fVar3;
  uVar2 = (uint)(short)src[0x11];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x13] = fVar3;
  uVar2 = (uint)(short)src[0x19];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x14] = fVar3;
  uVar2 = (uint)(short)src[0x1e];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x15] = fVar3;
  uVar2 = (uint)(short)src[0x29];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x16] = fVar3;
  uVar2 = (uint)(short)src[0x2b];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x17] = fVar3;
  uVar2 = (uint)(short)src[9];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x18] = fVar3;
  uVar2 = (uint)(short)src[0xb];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x19] = fVar3;
  uVar2 = (uint)(short)src[0x12];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x1a] = fVar3;
  uVar2 = (uint)(short)src[0x18];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x1b] = fVar3;
  uVar2 = (uint)(short)src[0x1f];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x1c] = fVar3;
  uVar2 = (uint)(short)src[0x28];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x1d] = fVar3;
  uVar2 = (uint)(short)src[0x2c];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x1e] = fVar3;
  uVar2 = (uint)(short)src[0x35];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x1f] = fVar3;
  uVar2 = (uint)(short)src[10];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x20] = fVar3;
  uVar2 = (uint)(short)src[0x13];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x21] = fVar3;
  uVar2 = (uint)(short)src[0x17];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x22] = fVar3;
  uVar2 = (uint)(short)src[0x20];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x23] = fVar3;
  uVar2 = (uint)(short)src[0x27];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x24] = fVar3;
  uVar2 = (uint)(short)src[0x2d];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x25] = fVar3;
  uVar2 = (uint)(short)src[0x34];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x26] = fVar3;
  uVar2 = (uint)(short)src[0x36];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x27] = fVar3;
  uVar2 = (uint)(short)src[0x14];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x28] = fVar3;
  uVar2 = (uint)(short)src[0x16];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x29] = fVar3;
  uVar2 = (uint)(short)src[0x21];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x2a] = fVar3;
  uVar2 = (uint)(short)src[0x26];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x2b] = fVar3;
  uVar2 = (uint)(short)src[0x2e];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x2c] = fVar3;
  uVar2 = (uint)(short)src[0x33];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x2d] = fVar3;
  uVar2 = (uint)(short)src[0x37];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x2e] = fVar3;
  uVar2 = (uint)(short)src[0x3c];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x2f] = fVar3;
  uVar2 = (uint)(short)src[0x15];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x30] = fVar3;
  uVar2 = (uint)(short)src[0x22];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x31] = fVar3;
  uVar2 = (uint)(short)src[0x25];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x32] = fVar3;
  uVar2 = (uint)(short)src[0x2f];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x33] = fVar3;
  uVar2 = (uint)(short)src[0x32];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x34] = fVar3;
  uVar2 = (uint)(short)src[0x38];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x35] = fVar3;
  uVar2 = (uint)(short)src[0x3b];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x36] = fVar3;
  uVar2 = (uint)(short)src[0x3d];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x37] = fVar3;
  uVar2 = (uint)(short)src[0x23];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x38] = fVar3;
  uVar2 = (uint)(short)src[0x24];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x39] = fVar3;
  uVar2 = (uint)(short)src[0x30];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x3a] = fVar3;
  uVar2 = (uint)(short)src[0x31];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x3b] = fVar3;
  uVar2 = (uint)(short)src[0x39];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x3c] = fVar3;
  uVar2 = (uint)(short)src[0x3a];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x3d] = fVar3;
  uVar2 = (uint)(short)src[0x3e];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x3e] = fVar3;
  uVar2 = (uint)(short)src[0x3f];
  uVar5 = (uVar2 & 0x7fff) << 0xd;
  fVar3 = (float)(uVar2 & 0x80000000);
  if (uVar5 < 0x800000) {
    if ((uVar2 & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0x7fff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar4 = (uVar1 ^ 0x1f) - 8;
      fVar3 = (float)(((uint)fVar3 | uVar5 << ((byte)iVar4 & 0x1f) | 0x38800000) + iVar4 * -0x800000
                     );
    }
  }
  else if (uVar5 < 0xf800000) {
    fVar3 = (float)(((uint)fVar3 | uVar5) + 0x38000000);
  }
  else {
    fVar3 = (float)((uint)fVar3 | uVar5 | 0x7f800000);
  }
  dst[0x3f] = fVar3;
  return;
}

Assistant:

static void
fromHalfZigZag_scalar (uint16_t* src, float* dst)
{
    dst[0] = half_to_float (src[0]);
    dst[1] = half_to_float (src[1]);
    dst[2] = half_to_float (src[5]);
    dst[3] = half_to_float (src[6]);
    dst[4] = half_to_float (src[14]);
    dst[5] = half_to_float (src[15]);
    dst[6] = half_to_float (src[27]);
    dst[7] = half_to_float (src[28]);
    dst[8] = half_to_float (src[2]);
    dst[9] = half_to_float (src[4]);

    dst[10] = half_to_float (src[7]);
    dst[11] = half_to_float (src[13]);
    dst[12] = half_to_float (src[16]);
    dst[13] = half_to_float (src[26]);
    dst[14] = half_to_float (src[29]);
    dst[15] = half_to_float (src[42]);
    dst[16] = half_to_float (src[3]);
    dst[17] = half_to_float (src[8]);
    dst[18] = half_to_float (src[12]);
    dst[19] = half_to_float (src[17]);

    dst[20] = half_to_float (src[25]);
    dst[21] = half_to_float (src[30]);
    dst[22] = half_to_float (src[41]);
    dst[23] = half_to_float (src[43]);
    dst[24] = half_to_float (src[9]);
    dst[25] = half_to_float (src[11]);
    dst[26] = half_to_float (src[18]);
    dst[27] = half_to_float (src[24]);
    dst[28] = half_to_float (src[31]);
    dst[29] = half_to_float (src[40]);

    dst[30] = half_to_float (src[44]);
    dst[31] = half_to_float (src[53]);
    dst[32] = half_to_float (src[10]);
    dst[33] = half_to_float (src[19]);
    dst[34] = half_to_float (src[23]);
    dst[35] = half_to_float (src[32]);
    dst[36] = half_to_float (src[39]);
    dst[37] = half_to_float (src[45]);
    dst[38] = half_to_float (src[52]);
    dst[39] = half_to_float (src[54]);

    dst[40] = half_to_float (src[20]);
    dst[41] = half_to_float (src[22]);
    dst[42] = half_to_float (src[33]);
    dst[43] = half_to_float (src[38]);
    dst[44] = half_to_float (src[46]);
    dst[45] = half_to_float (src[51]);
    dst[46] = half_to_float (src[55]);
    dst[47] = half_to_float (src[60]);
    dst[48] = half_to_float (src[21]);
    dst[49] = half_to_float (src[34]);

    dst[50] = half_to_float (src[37]);
    dst[51] = half_to_float (src[47]);
    dst[52] = half_to_float (src[50]);
    dst[53] = half_to_float (src[56]);
    dst[54] = half_to_float (src[59]);
    dst[55] = half_to_float (src[61]);
    dst[56] = half_to_float (src[35]);
    dst[57] = half_to_float (src[36]);
    dst[58] = half_to_float (src[48]);
    dst[59] = half_to_float (src[49]);

    dst[60] = half_to_float (src[57]);
    dst[61] = half_to_float (src[58]);
    dst[62] = half_to_float (src[62]);
    dst[63] = half_to_float (src[63]);
}